

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::object_method> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::object_method>,64ul,cs_impl::default_allocator_provider>
::alloc<cs_impl::any,cs_impl::any>
          (allocator_type<cs_impl::any::holder<cs::object_method>,_64UL,_cs_impl::default_allocator_provider>
           *this,any *args,any *args_1)

{
  proxy *ppVar1;
  __int_type _Var2;
  holder<cs::object_method> *__args;
  holder<cs::object_method> *in_RDX;
  new_allocator<cs_impl::any::holder<cs::object_method>_> *in_RSI;
  any *in_RDI;
  holder<cs::object_method> *ptr;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  if (in_RDI[0x41].mDat != (proxy *)0x0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDX);
    if (_Var2 == 0) {
      ppVar1 = in_RDI[0x41].mDat;
      in_RDI[0x41].mDat = (proxy *)((long)&ppVar1[-1].data + 7);
      __args = (holder<cs::object_method> *)in_RDI[(long)((long)&ppVar1[-1].data + 7)].mDat;
      goto LAB_00592164;
    }
  }
  __args = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::object_method>_>::allocate
                     (in_RSI,(size_type)in_RDX,pvVar3);
LAB_00592164:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::object_method>>::
  construct<cs_impl::any::holder<cs::object_method>,cs_impl::any,cs_impl::any>
            (in_RSI,in_RDX,(any *)__args,in_RDI);
  return __args;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}